

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

QList<QList<QGraphicsItem_*>_> * __thiscall
QList<QList<QGraphicsItem_*>_>::fill
          (QList<QList<QGraphicsItem_*>_> *this,parameter_type t,qsizetype newSize)

{
  qsizetype *pqVar1;
  Data *pDVar2;
  Data *pDVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  QGraphicsItem **ppQVar6;
  long lVar7;
  QList<QGraphicsItem_*> *pQVar8;
  QArrayDataPointer<QGraphicsItem_*> *this_00;
  long lVar9;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QList<QGraphicsItem_*>_> local_58;
  QArrayData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar2 = (this->d).d;
  if ((pDVar2 != (Data *)0x0) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (pDVar2 == (Data *)0x0) {
      lVar9 = 0;
    }
    else {
      lVar9 = (pDVar2->super_QArrayData).alloc;
    }
    if (newSize <= lVar9) {
      pQVar5 = &((t->d).d)->super_QArrayData;
      ppQVar6 = (t->d).ptr;
      qVar4 = (t->d).size;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar9 = (this->d).size;
      if (newSize <= lVar9) {
        lVar9 = newSize;
      }
      if (lVar9 != 0) {
        lVar9 = lVar9 * 0x18;
        this_00 = &((this->d).ptr)->d;
        do {
          QArrayDataPointer<QGraphicsItem_*>::operator=(this_00,&t->d);
          lVar9 = lVar9 + -0x18;
          this_00 = this_00 + 1;
        } while (lVar9 != 0);
      }
      lVar9 = (this->d).size;
      if (lVar9 < newSize) {
        if (newSize != lVar9) {
          pQVar8 = (this->d).ptr;
          lVar9 = lVar9 - newSize;
          do {
            lVar7 = (this->d).size;
            pQVar8[lVar7].d.d = (Data *)pQVar5;
            pQVar8[lVar7].d.ptr = ppQVar6;
            pQVar8[lVar7].d.size = qVar4;
            if (pQVar5 != (QArrayData *)0x0) {
              LOCK();
              (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pqVar1 = &(this->d).size;
            *pqVar1 = *pqVar1 + 1;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0);
        }
      }
      else if (newSize < lVar9) {
        pQVar8 = (this->d).ptr;
        std::_Destroy_aux<false>::__destroy<QList<QGraphicsItem*>*>(pQVar8 + newSize,pQVar8 + lVar9)
        ;
        (this->d).size = newSize;
      }
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar5,8,0x10);
        }
      }
      goto LAB_0063042f;
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QList<QGraphicsItem_*> *)&DAT_aaaaaaaaaaaaaaaa;
  lVar9 = newSize;
  if (pDVar2 != (Data *)0x0) {
    lVar9 = (pDVar2->super_QArrayData).alloc;
    if (lVar9 <= newSize) {
      lVar9 = newSize;
    }
    if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      lVar9 = newSize;
    }
  }
  local_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar8 = (QList<QGraphicsItem_*> *)QArrayData::allocate(&local_40,0x18,0x10,lVar9,KeepSize);
  local_58.size = 0;
  for (; newSize != 0; newSize = newSize + -1) {
    pDVar3 = (t->d).d;
    pQVar8[local_58.size].d.d = pDVar3;
    pQVar8[local_58.size].d.ptr = (t->d).ptr;
    pQVar8[local_58.size].d.size = (t->d).size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.size = local_58.size + 1;
  }
  local_58.d = (this->d).d;
  local_58.ptr = (this->d).ptr;
  (this->d).d = (Data *)local_40;
  (this->d).ptr = pQVar8;
  qVar4 = (this->d).size;
  (this->d).size = local_58.size;
  local_58.size = qVar4;
  QArrayDataPointer<QList<QGraphicsItem_*>_>::~QArrayDataPointer(&local_58);
LAB_0063042f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}